

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O0

uint32_t get_pos_len_price(lzma_coder_conflict9 *coder,uint32_t pos,uint32_t len,uint32_t pos_state)

{
  uint32_t uVar1;
  uint local_2c;
  uint32_t local_24;
  uint32_t pos_slot;
  uint32_t price;
  uint32_t len_to_pos_state;
  uint32_t pos_state_local;
  uint32_t len_local;
  uint32_t pos_local;
  lzma_coder_conflict9 *coder_local;
  
  if (len < 6) {
    local_2c = len - 2;
  }
  else {
    local_2c = 3;
  }
  if (pos < 0x80) {
    local_24 = coder->distances_prices[local_2c][pos];
  }
  else {
    uVar1 = get_pos_slot_2(pos);
    local_24 = coder->pos_slot_prices[local_2c][uVar1] + coder->align_prices[pos & 0xf];
  }
  uVar1 = get_len_price(&coder->match_len_encoder,len,pos_state);
  return uVar1 + local_24;
}

Assistant:

static inline uint32_t
get_pos_len_price(const lzma_coder *const coder, const uint32_t pos,
		const uint32_t len, const uint32_t pos_state)
{
	const uint32_t len_to_pos_state = get_len_to_pos_state(len);
	uint32_t price;

	if (pos < FULL_DISTANCES) {
		price = coder->distances_prices[len_to_pos_state][pos];
	} else {
		const uint32_t pos_slot = get_pos_slot_2(pos);
		price = coder->pos_slot_prices[len_to_pos_state][pos_slot]
				+ coder->align_prices[pos & ALIGN_MASK];
	}

	price += get_len_price(&coder->match_len_encoder, len, pos_state);

	return price;
}